

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O0

void __thiscall crnlib::crn_comp::clear(crn_comp *this)

{
  uint local_20;
  uint local_1c;
  uint i_1;
  uint i;
  uint l;
  uint f;
  crn_comp *this_local;
  
  this->m_pParams = (crn_comp_params *)0x0;
  for (i = 0; i < 6; i = i + 1) {
    for (i_1 = 0; i_1 < 0x10; i_1 = i_1 + 1) {
      image<crnlib::color_quad<unsigned_char,_int>_>::clear(this->m_images[i] + i_1);
    }
  }
  utils::zero_object<bool[3]>(&this->m_has_comp);
  this->m_has_etc_color_blocks = false;
  this->m_has_subblocks = false;
  vector<crnlib::crn_comp::level_details>::clear(&this->m_levels);
  this->m_total_blocks = 0;
  vector<unsigned_int>::clear(&this->m_color_endpoints);
  vector<unsigned_int>::clear(&this->m_alpha_endpoints);
  vector<unsigned_int>::clear(&this->m_color_selectors);
  vector<unsigned_long_long>::clear(&this->m_alpha_selectors);
  vector<crnlib::dxt_hc::endpoint_indices_details>::clear(&this->m_endpoint_indices);
  vector<crnlib::dxt_hc::selector_indices_details>::clear(&this->m_selector_indices);
  utils::zero_object<crnd::crn_header>(&this->m_crn_header);
  vector<unsigned_char>::clear(&this->m_comp_data);
  dxt_hc::clear(&this->m_hvq);
  symbol_histogram::clear(&this->m_reference_hist);
  static_huffman_data_model::clear(&this->m_reference_dm);
  for (local_1c = 0; local_1c < 2; local_1c = local_1c + 1) {
    vector<unsigned_short>::clear(this->m_endpoint_remaping + local_1c);
    symbol_histogram::clear(this->m_endpoint_index_hist + local_1c);
    static_huffman_data_model::clear
              ((static_huffman_data_model *)
               ((long)this->m_endpoint_index_hist + (ulong)local_1c * 0x38 + 0x20));
    vector<unsigned_short>::clear(this->m_selector_remaping + local_1c);
    symbol_histogram::clear(this->m_selector_index_hist + local_1c);
    static_huffman_data_model::clear
              ((static_huffman_data_model *)
               ((long)this->m_selector_index_hist + (ulong)local_1c * 0x38 + 0x20));
  }
  for (local_20 = 0; local_20 < 0x10; local_20 = local_20 + 1) {
    vector<unsigned_char>::clear(this->m_packed_blocks + local_20);
  }
  vector<unsigned_char>::clear(&this->m_packed_data_models);
  vector<unsigned_char>::clear(&this->m_packed_color_endpoints);
  vector<unsigned_char>::clear(&this->m_packed_color_selectors);
  vector<unsigned_char>::clear(&this->m_packed_alpha_endpoints);
  vector<unsigned_char>::clear(&this->m_packed_alpha_selectors);
  return;
}

Assistant:

void crn_comp::clear() {
  m_pParams = NULL;

  for (uint f = 0; f < cCRNMaxFaces; f++)
    for (uint l = 0; l < cCRNMaxLevels; l++)
      m_images[f][l].clear();

  utils::zero_object(m_has_comp);
  m_has_etc_color_blocks = false;
  m_has_subblocks = false;

  m_levels.clear();

  m_total_blocks = 0;
  m_color_endpoints.clear();
  m_alpha_endpoints.clear();
  m_color_selectors.clear();
  m_alpha_selectors.clear();
  m_endpoint_indices.clear();
  m_selector_indices.clear();

  utils::zero_object(m_crn_header);

  m_comp_data.clear();

  m_hvq.clear();

  m_reference_hist.clear();
  m_reference_dm.clear();
  for (uint i = 0; i < 2; i++) {
    m_endpoint_remaping[i].clear();
    m_endpoint_index_hist[i].clear();
    m_endpoint_index_dm[i].clear();
    m_selector_remaping[i].clear();
    m_selector_index_hist[i].clear();
    m_selector_index_dm[i].clear();
  }

  for (uint i = 0; i < cCRNMaxLevels; i++)
    m_packed_blocks[i].clear();

  m_packed_data_models.clear();

  m_packed_color_endpoints.clear();
  m_packed_color_selectors.clear();
  m_packed_alpha_endpoints.clear();
  m_packed_alpha_selectors.clear();
}